

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTestGenerator.cxx
# Opt level: O3

void __thiscall
cmTestGenerator::GenerateScriptForConfig
          (cmTestGenerator *this,ostream *os,string *config,Indent indent)

{
  pointer pcVar1;
  cmTest *pcVar2;
  cmTestGenerator *pcVar3;
  TargetType TVar4;
  cmListFileBacktrace *backtrace;
  ostream *poVar5;
  cmGeneratorTarget *this_00;
  char *pcVar6;
  _Base_ptr p_Var7;
  size_t sVar8;
  pointer pbVar9;
  string *str;
  Indent IVar10;
  _Rb_tree_header *p_Var11;
  string emulatorExe;
  allocator local_d1;
  cmTestGenerator *local_d0;
  undefined1 local_c8 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  emulatorWithArgs;
  undefined1 local_88 [8];
  string exe;
  cmGeneratorExpression ge;
  
  this->TestGenerated = true;
  local_d0 = this;
  backtrace = cmTest::GetBacktrace(this->Test);
  cmGeneratorExpression::cmGeneratorExpression(&ge,backtrace);
  IVar10.Level = indent.Level;
  if (0 < indent.Level) {
    do {
      std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
      IVar10.Level = IVar10.Level + -1;
    } while (IVar10.Level != 0);
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"add_test(",9);
  exe._M_dataplus._M_p = (pointer)&exe.field_2;
  pcVar1 = (local_d0->Test->Name)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&exe,pcVar1,pcVar1 + (local_d0->Test->Name)._M_string_length);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (os,exe._M_dataplus._M_p,exe._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)exe._M_dataplus._M_p != &exe.field_2) {
    operator_delete(exe._M_dataplus._M_p,exe.field_2._M_allocated_capacity + 1);
  }
  pcVar3 = local_d0;
  pcVar2 = local_d0->Test;
  pbVar9 = (pcVar2->Command).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  exe._M_dataplus._M_p = (pointer)&exe.field_2;
  pcVar1 = (pbVar9->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>((string *)&exe,pcVar1,pcVar1 + pbVar9->_M_string_length)
  ;
  this_00 = cmLocalGenerator::FindGeneratorTargetToUse(pcVar3->LG,&exe);
  if ((this_00 == (cmGeneratorTarget *)0x0) ||
     (TVar4 = cmGeneratorTarget::GetType(this_00), TVar4 != EXECUTABLE)) {
    cmGeneratorExpression::Parse((cmGeneratorExpression *)local_c8,(char *)&ge);
    emulatorExe._M_string_length = 0;
    emulatorExe.field_2._M_local_buf[0] = '\0';
    emulatorExe._M_dataplus._M_p = (pointer)&emulatorExe.field_2;
    pcVar6 = cmCompiledGeneratorExpression::Evaluate
                       ((cmCompiledGeneratorExpression *)local_c8._0_8_,local_d0->LG,config,false,
                        (cmGeneratorTarget *)0x0,(cmGeneratorTarget *)0x0,
                        (cmGeneratorExpressionDAGChecker *)0x0,&emulatorExe);
    strlen(pcVar6);
    std::__cxx11::string::_M_replace((ulong)&exe,0,(char *)exe._M_string_length,(ulong)pcVar6);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)emulatorExe._M_dataplus._M_p != &emulatorExe.field_2) {
      operator_delete(emulatorExe._M_dataplus._M_p,
                      CONCAT71(emulatorExe.field_2._M_allocated_capacity._1_7_,
                               emulatorExe.field_2._M_local_buf[0]) + 1);
    }
    ::cm::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
              ((auto_ptr<cmCompiledGeneratorExpression> *)local_c8);
    cmsys::SystemTools::ConvertToUnixSlashes(&exe);
  }
  else {
    cmGeneratorTarget::GetFullPath(&emulatorExe,this_00,config,RuntimeBinaryArtifact,false);
    std::__cxx11::string::operator=((string *)&exe,(string *)&emulatorExe);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)emulatorExe._M_dataplus._M_p != &emulatorExe.field_2) {
      operator_delete(emulatorExe._M_dataplus._M_p,
                      CONCAT71(emulatorExe.field_2._M_allocated_capacity._1_7_,
                               emulatorExe.field_2._M_local_buf[0]) + 1);
    }
    emulatorExe._M_dataplus._M_p = (pointer)&emulatorExe.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&emulatorExe,"CROSSCOMPILING_EMULATOR","");
    pcVar6 = cmGeneratorTarget::GetProperty(this_00,&emulatorExe);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)emulatorExe._M_dataplus._M_p != &emulatorExe.field_2) {
      operator_delete(emulatorExe._M_dataplus._M_p,
                      CONCAT71(emulatorExe.field_2._M_allocated_capacity._1_7_,
                               emulatorExe.field_2._M_local_buf[0]) + 1);
    }
    if (pcVar6 != (char *)0x0) {
      emulatorWithArgs.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      emulatorWithArgs.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      emulatorWithArgs.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      emulatorExe._M_dataplus._M_p = (pointer)&emulatorExe.field_2;
      sVar8 = strlen(pcVar6);
      std::__cxx11::string::_M_construct<char_const*>((string *)&emulatorExe,pcVar6,pcVar6 + sVar8);
      cmSystemTools::ExpandListArgument(&emulatorExe,&emulatorWithArgs,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)emulatorExe._M_dataplus._M_p != &emulatorExe.field_2) {
        operator_delete(emulatorExe._M_dataplus._M_p,
                        CONCAT71(emulatorExe.field_2._M_allocated_capacity._1_7_,
                                 emulatorExe.field_2._M_local_buf[0]) + 1);
      }
      emulatorExe._M_dataplus._M_p = (pointer)&emulatorExe.field_2;
      pcVar1 = ((emulatorWithArgs.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&emulatorExe,pcVar1,
                 pcVar1 + (emulatorWithArgs.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->_M_string_length);
      cmsys::SystemTools::ConvertToUnixSlashes(&emulatorExe);
      cmOutputConverter::EscapeForCMake((string *)local_c8,&emulatorExe);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (os,(char *)local_c8._0_8_,local_c8._8_8_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
      if ((cmState *)local_c8._0_8_ != (cmState *)(local_c8 + 0x10)) {
        operator_delete((void *)local_c8._0_8_,local_c8._16_8_ + 1);
      }
      str = emulatorWithArgs.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start + 1;
      if (str != emulatorWithArgs.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish) {
        do {
          cmOutputConverter::EscapeForCMake((string *)local_c8,str);
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                             (os,(char *)local_c8._0_8_,local_c8._8_8_);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
          if ((cmState *)local_c8._0_8_ != (cmState *)(local_c8 + 0x10)) {
            operator_delete((void *)local_c8._0_8_,local_c8._16_8_ + 1);
          }
          str = str + 1;
        } while (str != emulatorWithArgs.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)emulatorExe._M_dataplus._M_p != &emulatorExe.field_2) {
        operator_delete(emulatorExe._M_dataplus._M_p,
                        CONCAT71(emulatorExe.field_2._M_allocated_capacity._1_7_,
                                 emulatorExe.field_2._M_local_buf[0]) + 1);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&emulatorWithArgs);
    }
  }
  cmOutputConverter::EscapeForCMake(&emulatorExe,&exe);
  std::__ostream_insert<char,std::char_traits<char>>
            (os,emulatorExe._M_dataplus._M_p,emulatorExe._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)emulatorExe._M_dataplus._M_p != &emulatorExe.field_2) {
    operator_delete(emulatorExe._M_dataplus._M_p,
                    CONCAT71(emulatorExe.field_2._M_allocated_capacity._1_7_,
                             emulatorExe.field_2._M_local_buf[0]) + 1);
  }
  pbVar9 = (pcVar2->Command).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start + 1;
  if (pbVar9 != (pcVar2->Command).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
      cmGeneratorExpression::Parse((cmGeneratorExpression *)local_88,(string *)&ge);
      emulatorWithArgs.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)&emulatorWithArgs.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
      emulatorWithArgs.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      emulatorWithArgs.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)((ulong)emulatorWithArgs.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage & 0xffffffffffffff00)
      ;
      pcVar6 = cmCompiledGeneratorExpression::Evaluate
                         ((cmCompiledGeneratorExpression *)local_88,local_d0->LG,config,false,
                          (cmGeneratorTarget *)0x0,(cmGeneratorTarget *)0x0,
                          (cmGeneratorExpressionDAGChecker *)0x0,(string *)&emulatorWithArgs);
      std::__cxx11::string::string((string *)local_c8,pcVar6,&local_d1);
      cmOutputConverter::EscapeForCMake(&emulatorExe,(string *)local_c8);
      std::__ostream_insert<char,std::char_traits<char>>
                (os,emulatorExe._M_dataplus._M_p,emulatorExe._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)emulatorExe._M_dataplus._M_p != &emulatorExe.field_2) {
        operator_delete(emulatorExe._M_dataplus._M_p,
                        CONCAT71(emulatorExe.field_2._M_allocated_capacity._1_7_,
                                 emulatorExe.field_2._M_local_buf[0]) + 1);
      }
      if ((cmState *)local_c8._0_8_ != (cmState *)(local_c8 + 0x10)) {
        operator_delete((void *)local_c8._0_8_,local_c8._16_8_ + 1);
      }
      if (emulatorWithArgs.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          (pointer)&emulatorWithArgs.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        operator_delete(emulatorWithArgs.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (ulong)((long)&((emulatorWithArgs.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                       _M_dataplus)._M_p + 1));
      }
      ::cm::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
                ((auto_ptr<cmCompiledGeneratorExpression> *)local_88);
      pbVar9 = pbVar9 + 1;
    } while (pbVar9 != (pcVar2->Command).
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,")\n",2);
  pcVar2 = local_d0->Test;
  if ((pcVar2->Properties).
      super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
      ._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    if (0 < indent.Level) {
      do {
        std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
        indent.Level = indent.Level + -1;
      } while (indent.Level != 0);
    }
    std::__ostream_insert<char,std::char_traits<char>>(os,"set_tests_properties(",0x15);
    emulatorExe._M_dataplus._M_p = (pointer)&emulatorExe.field_2;
    pcVar1 = (local_d0->Test->Name)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&emulatorExe,pcVar1,pcVar1 + (local_d0->Test->Name)._M_string_length);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (os,emulatorExe._M_dataplus._M_p,emulatorExe._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," PROPERTIES ",0xc);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)emulatorExe._M_dataplus._M_p != &emulatorExe.field_2) {
      operator_delete(emulatorExe._M_dataplus._M_p,
                      CONCAT71(emulatorExe.field_2._M_allocated_capacity._1_7_,
                               emulatorExe.field_2._M_local_buf[0]) + 1);
    }
    p_Var7 = (pcVar2->Properties).
             super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
             ._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var11 = &(pcVar2->Properties).
               super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
               ._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var7 != p_Var11) {
      do {
        std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (os,*(char **)(p_Var7 + 1),(long)p_Var7[1]._M_parent);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
        cmProperty::GetValue((cmProperty *)(p_Var7 + 2));
        cmGeneratorExpression::Parse((cmGeneratorExpression *)local_88,(char *)&ge);
        emulatorWithArgs.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pointer)&emulatorWithArgs.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage;
        emulatorWithArgs.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        emulatorWithArgs.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             (pointer)((ulong)emulatorWithArgs.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage &
                      0xffffffffffffff00);
        pcVar6 = cmCompiledGeneratorExpression::Evaluate
                           ((cmCompiledGeneratorExpression *)local_88,local_d0->LG,config,false,
                            (cmGeneratorTarget *)0x0,(cmGeneratorTarget *)0x0,
                            (cmGeneratorExpressionDAGChecker *)0x0,(string *)&emulatorWithArgs);
        std::__cxx11::string::string((string *)local_c8,pcVar6,&local_d1);
        cmOutputConverter::EscapeForCMake(&emulatorExe,(string *)local_c8);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar5,emulatorExe._M_dataplus._M_p,emulatorExe._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)emulatorExe._M_dataplus._M_p != &emulatorExe.field_2) {
          operator_delete(emulatorExe._M_dataplus._M_p,
                          CONCAT71(emulatorExe.field_2._M_allocated_capacity._1_7_,
                                   emulatorExe.field_2._M_local_buf[0]) + 1);
        }
        if ((cmState *)local_c8._0_8_ != (cmState *)(local_c8 + 0x10)) {
          operator_delete((void *)local_c8._0_8_,local_c8._16_8_ + 1);
        }
        if (emulatorWithArgs.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            (pointer)&emulatorWithArgs.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          operator_delete(emulatorWithArgs.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (ulong)((long)&((emulatorWithArgs.
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                         _M_dataplus)._M_p + 1));
        }
        ::cm::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
                  ((auto_ptr<cmCompiledGeneratorExpression> *)local_88);
        p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7);
      } while ((_Rb_tree_header *)p_Var7 != p_Var11);
    }
    std::__ostream_insert<char,std::char_traits<char>>(os,")",1);
    std::ios::widen((char)os->_vptr_basic_ostream[-3] + (char)os);
    std::ostream::put((char)os);
    std::ostream::flush();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)exe._M_dataplus._M_p != &exe.field_2) {
    operator_delete(exe._M_dataplus._M_p,exe.field_2._M_allocated_capacity + 1);
  }
  cmGeneratorExpression::~cmGeneratorExpression(&ge);
  return;
}

Assistant:

void cmTestGenerator::GenerateScriptForConfig(std::ostream& os,
                                              const std::string& config,
                                              Indent indent)
{
  this->TestGenerated = true;

  // Set up generator expression evaluation context.
  cmGeneratorExpression ge(this->Test->GetBacktrace());

  // Start the test command.
  os << indent << "add_test(" << this->Test->GetName() << " ";

  // Get the test command line to be executed.
  std::vector<std::string> const& command = this->Test->GetCommand();

  // Check whether the command executable is a target whose name is to
  // be translated.
  std::string exe = command[0];
  cmGeneratorTarget* target = this->LG->FindGeneratorTargetToUse(exe);
  if (target && target->GetType() == cmStateEnums::EXECUTABLE) {
    // Use the target file on disk.
    exe = target->GetFullPath(config);

    // Prepend with the emulator when cross compiling if required.
    const char* emulator = target->GetProperty("CROSSCOMPILING_EMULATOR");
    if (emulator != CM_NULLPTR) {
      std::vector<std::string> emulatorWithArgs;
      cmSystemTools::ExpandListArgument(emulator, emulatorWithArgs);
      std::string emulatorExe(emulatorWithArgs[0]);
      cmSystemTools::ConvertToUnixSlashes(emulatorExe);
      os << cmOutputConverter::EscapeForCMake(emulatorExe) << " ";
      for (std::vector<std::string>::const_iterator ei =
             emulatorWithArgs.begin() + 1;
           ei != emulatorWithArgs.end(); ++ei) {
        os << cmOutputConverter::EscapeForCMake(*ei) << " ";
      }
    }
  } else {
    // Use the command name given.
    exe = ge.Parse(exe.c_str())->Evaluate(this->LG, config);
    cmSystemTools::ConvertToUnixSlashes(exe);
  }

  // Generate the command line with full escapes.
  os << cmOutputConverter::EscapeForCMake(exe);
  for (std::vector<std::string>::const_iterator ci = command.begin() + 1;
       ci != command.end(); ++ci) {
    os << " " << cmOutputConverter::EscapeForCMake(
                   ge.Parse(*ci)->Evaluate(this->LG, config));
  }

  // Finish the test command.
  os << ")\n";

  // Output properties for the test.
  cmPropertyMap& pm = this->Test->GetProperties();
  if (!pm.empty()) {
    os << indent << "set_tests_properties(" << this->Test->GetName()
       << " PROPERTIES ";
    for (cmPropertyMap::const_iterator i = pm.begin(); i != pm.end(); ++i) {
      os << " " << i->first << " "
         << cmOutputConverter::EscapeForCMake(
              ge.Parse(i->second.GetValue())->Evaluate(this->LG, config));
    }
    os << ")" << std::endl;
  }
}